

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcole.c
# Opt level: O0

int ffg3de(fitsfile *fptr,long group,float nulval,LONGLONG ncols,LONGLONG nrows,LONGLONG naxis1,
          LONGLONG naxis2,LONGLONG naxis3,float *array,int *anynul,int *status)

{
  int iVar1;
  LONGLONG local_f8;
  float local_ec;
  LONGLONG LStack_e8;
  float nullvalue;
  LONGLONG lpixel [3];
  LONGLONG local_c8;
  LONGLONG fpixel [3];
  long local_a8;
  long inc [3];
  char local_81;
  int nullcheck;
  char cdummy;
  LONGLONG jj;
  LONGLONG ii;
  LONGLONG nfits;
  LONGLONG narray;
  long tablerow;
  LONGLONG naxis2_local;
  LONGLONG naxis1_local;
  LONGLONG nrows_local;
  LONGLONG ncols_local;
  long lStack_30;
  float nulval_local;
  long group_local;
  fitsfile *fptr_local;
  
  local_a8 = 1;
  inc[0] = 1;
  inc[1] = 1;
  local_c8 = 1;
  fpixel[0] = 1;
  fpixel[1] = 1;
  tablerow = naxis2;
  naxis2_local = naxis1;
  naxis1_local = nrows;
  nrows_local = ncols;
  ncols_local._4_4_ = nulval;
  lStack_30 = group;
  group_local = (long)fptr;
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    if (lStack_30 < 1) {
      local_f8 = 1;
    }
    else {
      local_f8 = lStack_30;
    }
    narray = local_f8;
    if ((nrows_local == naxis2_local) && (naxis1_local == tablerow)) {
      ffgcle((fitsfile *)group_local,2,local_f8,1,naxis2_local * tablerow * naxis3,1,1,
             ncols_local._4_4_,array,&local_81,anynul,status);
      fptr_local._4_4_ = *status;
    }
    else if ((nrows_local < naxis2_local) || (naxis1_local < tablerow)) {
      *status = 0x140;
      fptr_local._4_4_ = 0x140;
    }
    else {
      ii = 1;
      nfits = 0;
      for (_nullcheck = 0; _nullcheck < naxis3; _nullcheck = _nullcheck + 1) {
        for (jj = 0; jj < tablerow; jj = jj + 1) {
          iVar1 = ffgcle((fitsfile *)group_local,2,narray,ii,naxis2_local,1,1,ncols_local._4_4_,
                         array + nfits,&local_81,anynul,status);
          if (0 < iVar1) {
            return *status;
          }
          ii = naxis2_local + ii;
          nfits = nrows_local + nfits;
        }
        nfits = (naxis1_local - tablerow) * nrows_local + nfits;
      }
      fptr_local._4_4_ = *status;
    }
  }
  else {
    LStack_e8 = nrows_local;
    lpixel[0] = naxis1_local;
    lpixel[1] = naxis3;
    local_ec = ncols_local._4_4_;
    fits_read_compressed_img
              ((fitsfile *)group_local,0x2a,&local_c8,&stack0xffffffffffffff18,&local_a8,1,&local_ec
               ,array,(char *)0x0,anynul,status);
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffg3de(fitsfile *fptr,  /* I - FITS file pointer                       */
           long  group,     /* I - group to read (1 = 1st group)           */
           float nulval,    /* set undefined pixels equal to this          */
           LONGLONG  ncols,     /* I - number of pixels in each row of array   */
           LONGLONG  nrows,     /* I - number of rows in each plane of array   */
           LONGLONG  naxis1,    /* I - FITS image NAXIS1 value                 */
           LONGLONG  naxis2,    /* I - FITS image NAXIS2 value                 */
           LONGLONG  naxis3,    /* I - FITS image NAXIS3 value                 */
           float *array,    /* O - array to be filled and returned         */
           int  *anynul,    /* O - set to 1 if any values are null; else 0 */
           int  *status)    /* IO - error status                           */
/*
  Read an entire 3-D array of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of the
  FITS array is not the same as the array being read).  Any null
  values in the array will be set equal to the value of nulval, unless
  nulval = 0 in which case no null checking will be performed.
*/
{
    long tablerow;
    LONGLONG narray, nfits, ii, jj;
    char cdummy;
    int nullcheck = 1;
    long inc[] = {1,1,1};
    LONGLONG fpixel[] = {1,1,1};
    LONGLONG lpixel[3];
    float nullvalue;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        lpixel[0] = ncols;
        lpixel[1] = nrows;
        lpixel[2] = naxis3;
        nullvalue = nulval;  /* set local variable */

        fits_read_compressed_img(fptr, TFLOAT, fpixel, lpixel, inc,
            nullcheck, &nullvalue, array, NULL, anynul, status);
        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */
    tablerow=maxvalue(1,group);

    if (ncols == naxis1 && nrows == naxis2)  /* arrays have same size? */
    {
       /* all the image pixels are contiguous, so read all at once */
       ffgcle(fptr, 2, tablerow, 1, naxis1 * naxis2 * naxis3, 1, 1, nulval,
               array, &cdummy, anynul, status);
       return(*status);
    }

    if (ncols < naxis1 || nrows < naxis2)
       return(*status = BAD_DIMEN);

    nfits = 1;   /* next pixel in FITS image to read */
    narray = 0;  /* next pixel in output array to be filled */

    /* loop over naxis3 planes in the data cube */
    for (jj = 0; jj < naxis3; jj++)
    {
      /* loop over the naxis2 rows in the FITS image, */
      /* reading naxis1 pixels to each row            */

      for (ii = 0; ii < naxis2; ii++)
      {
       if (ffgcle(fptr, 2, tablerow, nfits, naxis1, 1, 1, nulval,
          &array[narray], &cdummy, anynul, status) > 0)
          return(*status);

       nfits += naxis1;
       narray += ncols;
      }
      narray += (nrows - naxis2) * ncols;
    }

    return(*status);
}